

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManSetPhase1(Gia_Man_t *p)

{
  undefined1 *puVar1;
  int iVar2;
  long lVar3;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pObj;
  long lVar5;
  
  pVVar4 = p->vCis;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      iVar2 = pVVar4->pArray[lVar3];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar2].field_0x7;
      *puVar1 = *puVar1 | 0x80;
      lVar3 = lVar3 + 1;
      pVVar4 = p->vCis;
    } while (lVar3 < pVVar4->nSize);
  }
  if (0 < p->nObjs) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pObj = (Gia_Obj_t *)(&p->pObjs->field_0x0 + lVar3);
      if ((~*(uint *)pObj & 0x9fffffff) != 0) {
        Gia_ObjSetPhase(p,pObj);
      }
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar5 < p->nObjs);
  }
  return;
}

Assistant:

void Gia_ManSetPhase1( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachCi( p, pObj, i )
        pObj->fPhase = 1;
    Gia_ManForEachObj( p, pObj, i )
        if ( !Gia_ObjIsCi(pObj) )
            Gia_ObjSetPhase( p, pObj );
}